

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersennetwister.h
# Opt level: O1

void __thiscall MTRand::reload(MTRand *this)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar3 = 0;
  do {
    lVar2 = lVar3;
    uVar1 = *(uint *)((long)this->state + lVar2 + 8);
    *(ulong *)((long)this->state + lVar2) =
         (ulong)(-(uVar1 & 1) & 0x9908b0df) ^
         (ulong)((uVar1 & 0x7ffffffe | *(uint *)((long)this->state + lVar2) & 0x80000000) >> 1) ^
         *(ulong *)((long)this->state + lVar2 + 0xc68);
    lVar3 = lVar2 + 8;
  } while ((int)lVar3 != 0x718);
  lVar5 = 0;
  do {
    lVar4 = lVar5;
    uVar1 = *(uint *)((long)this->state + lVar4 * 8 + lVar2 + 0x10);
    *(ulong *)((long)this->state + lVar4 * 8 + lVar3) =
         (ulong)(-(uVar1 & 1) & 0x9908b0df) ^
         (ulong)((uVar1 & 0x7ffffffe | *(uint *)((long)this->state + lVar4 * 8 + lVar3) & 0x80000000
                 ) >> 1) ^ *(ulong *)((long)this + lVar4 * 8 + lVar2 + -0x710);
    lVar5 = lVar4 + 1;
  } while ((int)lVar5 != 0x18c);
  uVar1 = (uint)this->state[0];
  *(ulong *)((long)this->state + lVar4 * 8 + 8 + lVar3) =
       (ulong)(-(uVar1 & 1) & 0x9908b0df) ^
       (ulong)((uVar1 & 0x7ffffffe |
               *(uint *)((long)this->state + lVar4 * 8 + 8 + lVar3) & 0x80000000) >> 1) ^
       *(ulong *)((long)this + lVar5 * 8 + lVar2 + -0x710);
  this->left = 0x270;
  this->pNext = this->state;
  return;
}

Assistant:

void MTRand::reload() {
  // Generate N new values in state
  // Made clearer and faster by Matthew Bellew (matthew.bellew@home.com)
  uint32 *p = state;
  int i;
  for (i = N - M; i--; ++p)
    *p = twist(p[M], p[0], p[1]);
  for (i = M; --i; ++p)
    *p = twist(p[M - N], p[0], p[1]);
  *p = twist(p[M - N], p[0], state[0]);

  left = N, pNext = state;
}